

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitCall(BinaryInstWriter *this,Call *curr)

{
  uint32_t value;
  BufferWithRandomAccess *this_00;
  U32LEB local_20;
  int8_t local_19;
  Call *pCStack_18;
  int8_t op;
  Call *curr_local;
  BinaryInstWriter *this_local;
  
  local_19 = '\x10';
  if ((curr->isReturn & 1U) != 0) {
    local_19 = '\x12';
  }
  pCStack_18 = curr;
  curr_local = (Call *)this;
  this_00 = BufferWithRandomAccess::operator<<(this->o,local_19);
  value = WasmBinaryWriter::getFunctionIndex
                    (this->parent,(Name)(pCStack_18->target).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_20,value);
  BufferWithRandomAccess::operator<<(this_00,local_20);
  return;
}

Assistant:

void BinaryInstWriter::visitCall(Call* curr) {
  int8_t op =
    curr->isReturn ? BinaryConsts::RetCallFunction : BinaryConsts::CallFunction;
  o << op << U32LEB(parent.getFunctionIndex(curr->target));
}